

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
emplace<QTlsPrivate::X509CertificateBase::X509CertificateExtension_const&>
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          qsizetype i,X509CertificateExtension *args)

{
  X509CertificateExtension **ppXVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_d8;
  X509CertificateExtension tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->
           super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
        size == i) {
      qVar5 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
              freeSpaceAtEnd(&this->
                              super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                            );
      if (qVar5 == 0) goto LAB_0010b1df;
      QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
                ((this->
                 super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                 ).ptr + (this->
                         super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                         ).size,args);
LAB_0010b306:
      pqVar2 = &(this->
                super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>)
                .size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0010b2bf;
    }
LAB_0010b1df:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
              freeSpaceAtBegin(&this->
                                super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                              );
      if (qVar5 != 0) {
        QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
                  ((this->
                   super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                   ).ptr + -1,args);
        ppXVar1 = &(this->
                   super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                   ).ptr;
        *ppXVar1 = *ppXVar1 + -1;
        goto LAB_0010b306;
      }
    }
  }
  tmp.critical = true;
  tmp.supported = true;
  tmp._82_6_ = 0xaaaaaaaaaaaa;
  tmp.value.d.data._16_8_ = 0xaaaaaaaaaaaaaaaa;
  tmp.value.d._24_8_ = 0xaaaaaaaaaaaaaaaa;
  tmp.value.d.data.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  tmp.value.d.data._8_8_ = 0xaaaaaaaaaaaaaaaa;
  tmp.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.name.d.size = -0x5555555555555556;
  tmp.oid.d.size = -0x5555555555555556;
  tmp.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.oid.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.oid.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
          ).size != 0;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::detachAndGrow
            (&this->
              super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>,
             (uint)(i == 0 && bVar6),1,(X509CertificateExtension **)0x0,
             (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)0x0);
  if (i == 0 && bVar6) {
    QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
              ((this->
               super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
               ptr + -1,&tmp);
    ppXVar1 = &(this->
               super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
               ptr;
    *ppXVar1 = *ppXVar1 + -1;
    pqVar2 = &(this->
              super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_d8.sourceCopyConstruct = 0;
    local_d8.nSource = 0;
    local_d8.move = 0;
    local_d8.sourceCopyAssign = 0;
    local_d8.end = (X509CertificateExtension *)0x0;
    local_d8.last = (X509CertificateExtension *)0x0;
    local_d8.where = (X509CertificateExtension *)0x0;
    local_d8.begin =
         (this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>)
         .ptr;
    local_d8.size =
         (this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>)
         .size;
    local_d8.data =
         &this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>;
    Inserter::insertOne(&local_d8,i,&tmp);
    (local_d8.data)->ptr = local_d8.begin;
    (local_d8.data)->size = local_d8.size;
  }
  QTlsPrivate::X509CertificateBase::X509CertificateExtension::~X509CertificateExtension(&tmp);
LAB_0010b2bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }